

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O0

string * __thiscall
flatbuffers::ts::TsGenerator::GenType_abi_cxx11_
          (string *__return_storage_ptr__,TsGenerator *this,Type *type)

{
  Type *type_00;
  Type *type_01;
  allocator<char> local_81;
  undefined1 local_80 [39];
  allocator<char> local_59;
  allocator<char> local_58;
  allocator<char> local_57;
  allocator<char> local_56;
  allocator<char> local_55;
  allocator<char> local_54;
  allocator<char> local_53;
  allocator<char> local_52;
  allocator<char> local_51;
  undefined1 local_50 [64];
  Type *type_local;
  
  local_50._56_8_ = this;
  type_local = (Type *)__return_storage_ptr__;
  switch(*(undefined4 *)&(this->super_BaseGenerator)._vptr_BaseGenerator) {
  case 1:
    GetUnionUnderlyingType((Type *)local_50,(Type *)this);
    GenType_abi_cxx11_(__return_storage_ptr__,(TsGenerator *)local_50,type_00);
    break;
  case 2:
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Int8",(allocator<char> *)(local_50 + 0x37));
    std::allocator<char>::~allocator((allocator<char> *)(local_50 + 0x37));
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Uint8",&local_51);
    std::allocator<char>::~allocator(&local_51);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Int16",&local_52);
    std::allocator<char>::~allocator(&local_52);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Uint16",&local_53);
    std::allocator<char>::~allocator(&local_53);
    break;
  case 7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Int32",&local_54);
    std::allocator<char>::~allocator(&local_54);
    break;
  case 8:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Uint32",&local_55);
    std::allocator<char>::~allocator(&local_55);
    break;
  case 9:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Int64",&local_56);
    std::allocator<char>::~allocator(&local_56);
    break;
  case 10:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Uint64",&local_57);
    std::allocator<char>::~allocator(&local_57);
    break;
  case 0xb:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Float32",&local_58);
    std::allocator<char>::~allocator(&local_58);
    break;
  case 0xc:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Float64",&local_59);
    std::allocator<char>::~allocator(&local_59);
    break;
  case 0xd:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"String",(allocator<char> *)(local_80 + 0x26));
    std::allocator<char>::~allocator((allocator<char> *)(local_80 + 0x26));
    break;
  case 0xe:
    Type::VectorType((Type *)local_80,(Type *)this);
    GenType_abi_cxx11_(__return_storage_ptr__,(TsGenerator *)local_80,type_01);
    break;
  case 0xf:
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)(this->super_BaseGenerator).parser_);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"flatbuffers.Table",&local_81);
    std::allocator<char>::~allocator(&local_81);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string GenType(const Type &type) {
    switch (type.base_type) {
      case BASE_TYPE_BOOL:
      case BASE_TYPE_CHAR: return "Int8";
      case BASE_TYPE_UTYPE: return GenType(GetUnionUnderlyingType(type));
      case BASE_TYPE_UCHAR: return "Uint8";
      case BASE_TYPE_SHORT: return "Int16";
      case BASE_TYPE_USHORT: return "Uint16";
      case BASE_TYPE_INT: return "Int32";
      case BASE_TYPE_UINT: return "Uint32";
      case BASE_TYPE_LONG: return "Int64";
      case BASE_TYPE_ULONG: return "Uint64";
      case BASE_TYPE_FLOAT: return "Float32";
      case BASE_TYPE_DOUBLE: return "Float64";
      case BASE_TYPE_STRING: return "String";
      case BASE_TYPE_VECTOR: return GenType(type.VectorType());
      case BASE_TYPE_STRUCT: return type.struct_def->name;
      default: return "flatbuffers.Table";
    }
  }